

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall t_php_generator::generate_program_header(t_php_generator *this,ostream *file)

{
  byte bVar1;
  ostream *poVar2;
  t_program *ptVar3;
  string local_a8;
  string local_88 [48];
  string local_58;
  string local_38;
  ostream *local_18;
  ostream *file_local;
  t_php_generator *this_local;
  
  local_18 = file;
  file_local = (ostream *)this;
  poVar2 = std::operator<<(file,"<?php");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_generator::get_program((t_generator *)this);
  php_namespace_suffix_abi_cxx11_(&local_38,this,ptVar3);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_38);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    poVar2 = std::operator<<(local_18,"namespace ");
    ptVar3 = t_generator::get_program((t_generator *)this);
    php_namespace_suffix_abi_cxx11_(&local_58,this,ptVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_58);
    poVar2 = std::operator<<(poVar2,";");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_58);
  }
  poVar2 = local_18;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])();
  poVar2 = std::operator<<(poVar2,local_88);
  php_includes_abi_cxx11_(&local_a8,this);
  std::operator<<(poVar2,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string(local_88);
  std::operator<<(local_18,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_php_generator::generate_program_header(std::ostream& file) {
  file << "<?php" << endl;
  if (!php_namespace_suffix(get_program()).empty()) {
    file << "namespace " << php_namespace_suffix(get_program()) << ";" << endl
         << endl;
  }
  file << autogen_comment() << php_includes();

  file << endl;
}